

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutPt * __thiscall
ClipperLib::Clipper::AddLocalMinPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *Pt)

{
  IntPoint pt2;
  bool bVar1;
  OutPt *op2;
  OutPt *outPt;
  IntPoint local_80;
  cInt local_70;
  cInt local_68;
  IntPoint local_60;
  cInt local_50;
  cInt xE;
  cInt xPrev;
  TEdge *prevE;
  TEdge *e;
  OutPt *result;
  IntPoint *Pt_local;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  result = (OutPt *)Pt;
  Pt_local = &e2->Bot;
  e2_local = e1;
  e1_local = (TEdge *)this;
  bVar1 = IsHorizontal(e2);
  if ((bVar1) || ((double)Pt_local[3].X <= e2_local->Dx && e2_local->Dx != (double)Pt_local[3].X)) {
    e = (TEdge *)AddOutPt(this,e2_local,(IntPoint *)result);
    *(int *)((long)&Pt_local[4].Y + 4) = e2_local->OutIdx;
    e2_local->Side = esLeft;
    *(undefined4 *)((long)&Pt_local[3].Y + 4) = 2;
    prevE = e2_local;
    if (e2_local->PrevInAEL == (TEdge *)Pt_local) {
      xPrev = Pt_local[7].X;
    }
    else {
      xPrev = (cInt)e2_local->PrevInAEL;
    }
  }
  else {
    e = (TEdge *)AddOutPt(this,(TEdge *)Pt_local,(IntPoint *)result);
    e2_local->OutIdx = *(int *)((long)&Pt_local[4].Y + 4);
    e2_local->Side = esRight;
    *(undefined4 *)((long)&Pt_local[3].Y + 4) = 1;
    prevE = (TEdge *)Pt_local;
    if ((TEdge *)Pt_local[7].X == e2_local) {
      xPrev = (cInt)e2_local->PrevInAEL;
    }
    else {
      xPrev = Pt_local[7].X;
    }
  }
  if ((((xPrev != 0) && (-1 < *(int *)(xPrev + 0x4c))) && (*(long *)(xPrev + 0x28) < (result->Pt).X)
      ) && ((prevE->Top).Y < (result->Pt).X)) {
    xE = TopX((TEdge *)xPrev,(result->Pt).X);
    local_50 = TopX(prevE,(result->Pt).X);
    if (((xE == local_50) && (prevE->WindDelta != 0)) && (*(int *)(xPrev + 0x40) != 0)) {
      IntPoint::IntPoint(&local_60,xE,(result->Pt).X);
      local_70 = *(cInt *)(xPrev + 0x20);
      local_68 = *(cInt *)(xPrev + 0x28);
      IntPoint::IntPoint(&local_80,local_50,(result->Pt).X);
      pt2.Y = local_68;
      pt2.X = local_70;
      bVar1 = SlopesEqual(local_60,pt2,local_80,prevE->Top,
                          (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                       [(long)&(this->m_GhostJoins).
                                               super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                       ] & 1));
      if (bVar1) {
        op2 = AddOutPt(this,(TEdge *)xPrev,(IntPoint *)result);
        AddJoin(this,(OutPt *)e,op2,prevE->Top);
      }
    }
  }
  return (OutPt *)e;
}

Assistant:

OutPt* Clipper::AddLocalMinPoly(TEdge *e1, TEdge *e2, const IntPoint &Pt)
{
  OutPt* result;
  TEdge *e, *prevE;
  if (IsHorizontal(*e2) || ( e1->Dx > e2->Dx ))
  {
    result = AddOutPt(e1, Pt);
    e2->OutIdx = e1->OutIdx;
    e1->Side = esLeft;
    e2->Side = esRight;
    e = e1;
    if (e->PrevInAEL == e2)
      prevE = e2->PrevInAEL; 
    else
      prevE = e->PrevInAEL;
  } else
  {
    result = AddOutPt(e2, Pt);
    e1->OutIdx = e2->OutIdx;
    e1->Side = esRight;
    e2->Side = esLeft;
    e = e2;
    if (e->PrevInAEL == e1)
        prevE = e1->PrevInAEL;
    else
        prevE = e->PrevInAEL;
  }

  if (prevE && prevE->OutIdx >= 0 && prevE->Top.Y < Pt.Y && e->Top.Y < Pt.Y) 
  {
    cInt xPrev = TopX(*prevE, Pt.Y);
    cInt xE = TopX(*e, Pt.Y);
    if (xPrev == xE && (e->WindDelta != 0) && (prevE->WindDelta != 0) &&
      SlopesEqual(IntPoint(xPrev, Pt.Y), prevE->Top, IntPoint(xE, Pt.Y), e->Top, m_UseFullRange))
    {
      OutPt* outPt = AddOutPt(prevE, Pt);
      AddJoin(result, outPt, e->Top);
    }
  }
  return result;
}